

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

opj_bool jp2_exec(opj_jp2_v2_t *jp2,opj_procedure_list_t *p_procedure_list,opj_stream_private_t *cio
                 ,opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 OVar1;
  int iVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  opj_procedure_list_t *in_RSI;
  undefined8 in_RDI;
  OPJ_UINT32 i;
  OPJ_UINT32 l_nb_proc;
  opj_bool l_result;
  _func_opj_bool_opj_jp2_v2_t_ptr_opj_stream_private_t_ptr_opj_event_mgr_t_ptr **l_procedure;
  bool local_35;
  uint local_34;
  uint local_2c;
  opj_procedure *local_28;
  
  local_2c = 1;
  OVar1 = opj_procedure_list_get_nb_procedures(in_RSI);
  local_28 = opj_procedure_list_get_first_procedure(in_RSI);
  for (local_34 = 0; local_34 < OVar1; local_34 = local_34 + 1) {
    local_35 = false;
    if (local_2c != 0) {
      iVar2 = (*(code *)*local_28)(in_RDI,in_RDX,in_RCX);
      local_35 = iVar2 != 0;
    }
    local_2c = (uint)local_35;
    local_28 = local_28 + 1;
  }
  opj_procedure_list_clear(in_RSI);
  return local_2c;
}

Assistant:

opj_bool jp2_exec (
					opj_jp2_v2_t * jp2,
					opj_procedure_list_t * p_procedure_list,
					opj_stream_private_t *cio,
					opj_event_mgr_t * p_manager
				  )
{
	opj_bool (** l_procedure) (opj_jp2_v2_t * jp2, opj_stream_private_t *, opj_event_mgr_t *) = 00;
	opj_bool l_result = OPJ_TRUE;
	OPJ_UINT32 l_nb_proc, i;

	/* preconditions */
	assert(p_procedure_list != 00);
	assert(jp2 != 00);
	assert(cio != 00);
	assert(p_manager != 00);

	l_nb_proc = opj_procedure_list_get_nb_procedures(p_procedure_list);
	l_procedure = (opj_bool (**) (opj_jp2_v2_t * jp2, opj_stream_private_t *, opj_event_mgr_t *)) opj_procedure_list_get_first_procedure(p_procedure_list);

	for	(i=0;i<l_nb_proc;++i) {
		l_result = l_result && (*l_procedure) (jp2,cio,p_manager);
		++l_procedure;
	}

	/* and clear the procedure list at the end. */
	opj_procedure_list_clear(p_procedure_list);
	return l_result;
}